

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O3

boolean revive_nasty(int x,int y,char *msg)

{
  obj *poVar1;
  monst *pmVar2;
  int iVar3;
  int iVar4;
  boolean bVar5;
  boolean bVar6;
  uint uVar7;
  obj *corpse;
  coord cc;
  coord local_4a;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  long local_38;
  
  local_38 = (long)y;
  corpse = level->objects[x][local_38];
  if (corpse != (obj *)0x0) {
    bVar5 = '\0';
    local_3c = (int)(char)x;
    local_40 = (int)(char)y;
    local_48 = x;
    local_44 = y;
    do {
      poVar1 = (corpse->v).v_nexthere;
      if (((corpse->otyp == 0x10e) && (uVar7 = corpse->corpsenm - 0x128, uVar7 < 0x1f)) &&
         ((0x70000001U >> (uVar7 & 0x1f) & 1) != 0)) {
        pmVar2 = level->monsters[x][local_38];
        if (((pmVar2 != (monst *)0x0) && ((pmVar2->field_0x61 & 2) == 0)) &&
           (bVar5 = enexto(&local_4a,level,(xchar)local_3c,(xchar)local_40,pmVar2->data),
           bVar5 != '\0')) {
          rloc_to(pmVar2,level,(int)local_4a.x,(int)local_4a.y);
        }
        if (msg != (char *)0x0) {
          Norep("%s",msg);
        }
        bVar5 = revive_corpse(corpse);
      }
      iVar4 = local_44;
      iVar3 = local_48;
      corpse = poVar1;
    } while (poVar1 != (obj *)0x0);
    if (bVar5 != '\0') {
      pmVar2 = level->monsters[x][local_38];
      if (pmVar2 == (monst *)0x0) {
        return bVar5;
      }
      if ((pmVar2->field_0x61 & 2) != 0) {
        return bVar5;
      }
      bVar6 = goodpos(level,local_48,local_44,pmVar2,0);
      if (bVar6 != '\0') {
        return bVar5;
      }
      bVar6 = enexto(&local_4a,level,(xchar)iVar3,(xchar)iVar4,pmVar2->data);
      if (bVar6 == '\0') {
        return bVar5;
      }
      rloc_to(pmVar2,level,(int)local_4a.x,(int)local_4a.y);
      return bVar5;
    }
  }
  return '\0';
}

Assistant:

boolean revive_nasty(int x, int y, const char *msg)
{
    struct obj *otmp, *otmp2;
    struct monst *mtmp;
    coord cc;
    boolean revived = FALSE;

    for (otmp = level->objects[x][y]; otmp; otmp = otmp2) {
	otmp2 = otmp->nexthere;
	if (otmp->otyp == CORPSE &&
	    (is_rider(&mons[otmp->corpsenm]) ||
	     otmp->corpsenm == PM_WIZARD_OF_YENDOR)) {
	    /* move any living monster already at that location */
	    if ((mtmp = m_at(level, x,y)) && enexto(&cc, level, x, y, mtmp->data))
		rloc_to(mtmp, level, cc.x, cc.y);
	    if (msg) Norep("%s", msg);
	    revived = revive_corpse(otmp);
	}
    }

    /* this location might not be safe, if not, move revived monster */
    if (revived) {
	mtmp = m_at(level, x,y);
	if (mtmp && !goodpos(level, x, y, mtmp, 0) &&
	    enexto(&cc, level, x, y, mtmp->data)) {
	    rloc_to(mtmp, level, cc.x, cc.y);
	}
	/* else impossible? */
    }

    return revived;
}